

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileValue
          (NodeTranslator *this,Reader source,Reader type,Schema typeScope,Builder target,
          bool isBootstrap)

{
  CapTableBuilder **resolver;
  Reader RVar1;
  StringPtr name;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  Which WVar5;
  uint16_t value_00;
  NullableValue<capnp::Type> *other;
  Type *pTVar6;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> *other_00;
  Orphan<capnp::DynamicValue> *pOVar7;
  Builder *value_01;
  ReaderFor<capnp::DynamicEnum> RVar8;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_320;
  Schema local_2f0;
  uint16_t local_2e8;
  Reader local_2e0;
  DynamicEnum local_298;
  undefined8 local_288;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_280;
  SegmentReader *local_278;
  CapTableReader *pCStack_270;
  void *local_268;
  WirePointer *pWStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  Maybe<capnp::Orphan<capnp::DynamicValue>_> local_248;
  undefined1 local_208 [8];
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> value;
  FieldSubset local_1c0;
  Field local_178;
  Reader local_138;
  ArrayPtr<const_char> local_108;
  char *pcStack_f8;
  StringPtr fieldName;
  Maybe<capnp::Type> local_98;
  undefined1 local_80 [8];
  NullableValue<capnp::Type> typeSchema;
  undefined1 local_58 [8];
  ValueTranslator valueTranslator;
  ResolverGlue glue;
  bool isBootstrap_local;
  NodeTranslator *this_local;
  Schema typeScope_local;
  
  RVar1._reader = source._reader;
  resolver = &valueTranslator.orphanage.capTable;
  compileValue(capnp::compiler::Expression::Reader,capnp::schema::Type::Reader,capnp::Schema,capnp::
  schema::Value::Builder,bool)::ResolverGlue::ResolverGlue(capnp::compiler::NodeTranslator__bool_
            (resolver,this,isBootstrap);
  typeSchema.field_1.value.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)(this->orphanage).arena;
  ValueTranslator::ValueTranslator
            ((ValueTranslator *)local_58,(Resolver *)resolver,this->errorReporter,this->orphanage);
  (*this->resolver->_vptr_Resolver[10])(&local_98,this->resolver,typeScope.raw);
  other = kj::_::readMaybe<capnp::Type>(&local_98);
  kj::_::NullableValue<capnp::Type>::NullableValue((NullableValue<capnp::Type> *)local_80,other);
  kj::Maybe<capnp::Type>::~Maybe(&local_98);
  pTVar6 = kj::_::NullableValue::operator_cast_to_Type_((NullableValue *)local_80);
  if (pTVar6 != (Type *)0x0) {
    value.field_1.value.builder.location = (word *)Schema::from<capnp::schema::Type>();
    StructSchema::getUnionFields(&local_1c0,(StructSchema *)&value.field_1.value.builder.location);
    pTVar6 = kj::_::NullableValue<capnp::Type>::operator->((NullableValue<capnp::Type> *)local_80);
    WVar5 = capnp::Type::which(pTVar6);
    StructSchema::FieldSubset::operator[](&local_178,&local_1c0,(uint)WVar5);
    StructSchema::Field::getProto(&local_138,&local_178);
    local_108 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_138);
    fieldName.content.ptr = (char *)local_108.size_;
    pcStack_f8 = local_108.ptr;
    local_278 = source._reader.segment;
    pCStack_270 = source._reader.capTable;
    local_268 = source._reader.data;
    pWStack_260 = source._reader.pointers;
    local_258._0_4_ = source._reader.dataSize;
    local_258._4_2_ = source._reader.pointerCount;
    local_258._6_2_ = source._reader._38_2_;
    source._reader._40_8_ = RVar1._reader._40_8_;
    uStack_250._0_4_ = source._reader.nestingLimit;
    uStack_250._4_4_ = source._reader._44_4_;
    pTVar6 = kj::_::NullableValue<capnp::Type>::operator*((NullableValue<capnp::Type> *)local_80);
    local_288._0_2_ = pTVar6->baseType;
    local_288._2_1_ = pTVar6->listDepth;
    local_288._3_1_ = pTVar6->isImplicitParam;
    local_288._4_2_ = pTVar6->field_3;
    local_288._6_2_ = *(undefined2 *)&pTVar6->field_0x6;
    aStack_280 = pTVar6->field_4;
    RVar1._reader.capTable._0_4_ = (int)pCStack_270;
    RVar1._reader.segment = local_278;
    RVar1._reader.capTable._4_4_ = (int)((ulong)pCStack_270 >> 0x20);
    RVar1._reader.data._0_4_ = (int)local_268;
    RVar1._reader.data._4_4_ = (int)((ulong)local_268 >> 0x20);
    RVar1._reader.pointers._0_4_ = (int)pWStack_260;
    RVar1._reader.pointers._4_4_ = (int)((ulong)pWStack_260 >> 0x20);
    RVar1._reader.dataSize = (StructDataBitCount)local_258;
    RVar1._reader._36_4_ = SUB84(local_258,4);
    RVar1._reader.nestingLimit = (int)uStack_250;
    RVar1._reader._44_4_ = SUB84(uStack_250,4);
    ValueTranslator::compileValue(&local_248,(ValueTranslator *)local_58,RVar1,*pTVar6);
    other_00 = kj::_::readMaybe<capnp::Orphan<capnp::DynamicValue>>(&local_248);
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_208,other_00);
    kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::~Maybe(&local_248);
    pOVar7 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_208);
    if (pOVar7 != (Orphan<capnp::DynamicValue> *)0x0) {
      pTVar6 = kj::_::NullableValue<capnp::Type>::operator->((NullableValue<capnp::Type> *)local_80)
      ;
      bVar4 = capnp::Type::isEnum(pTVar6);
      if (bVar4) {
        pOVar7 = kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::operator->
                           ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_208);
        Orphan<capnp::DynamicValue>::getReader(&local_2e0,pOVar7);
        RVar8 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_2e0);
        local_2f0.raw = (RawBrandedSchema *)RVar8.schema.super_Schema.raw;
        local_2e8 = RVar8.value;
        local_298.schema.super_Schema.raw = (Schema)(Schema)local_2f0.raw;
        local_298.value = local_2e8;
        value_00 = DynamicEnum::getRaw(&local_298);
        capnp::schema::Value::Builder::setEnum(&target,value_00);
        DynamicValue::Reader::~Reader(&local_2e0);
      }
      else {
        toDynamic<capnp::schema::Value::Builder&>(&local_320,(capnp *)&target,value_01);
        pcVar3 = fieldName.content.ptr;
        pcVar2 = pcStack_f8;
        pOVar7 = kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::operator*
                           ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_208);
        pOVar7 = kj::mv<capnp::Orphan<capnp::DynamicValue>>(pOVar7);
        name.content.size_ = (size_t)pcVar3;
        name.content.ptr = pcVar2;
        DynamicStruct::Builder::adopt(&local_320,name,pOVar7);
      }
    }
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_208);
  }
  kj::_::NullableValue<capnp::Type>::~NullableValue((NullableValue<capnp::Type> *)local_80);
  return;
}

Assistant:

void NodeTranslator::compileValue(Expression::Reader source, schema::Type::Reader type,
                                  Schema typeScope, schema::Value::Builder target,
                                  bool isBootstrap) {
  class ResolverGlue: public ValueTranslator::Resolver {
  public:
    inline ResolverGlue(NodeTranslator& translator, bool isBootstrap)
        : translator(translator), isBootstrap(isBootstrap) {}

    kj::Maybe<DynamicValue::Reader> resolveConstant(Expression::Reader name) override {
      return translator.readConstant(name, isBootstrap);
    }

    kj::Maybe<kj::Array<const byte>> readEmbed(LocatedText::Reader filename) override {
      return translator.readEmbed(filename);
    }

  private:
    NodeTranslator& translator;
    bool isBootstrap;
  };

  ResolverGlue glue(*this, isBootstrap);
  ValueTranslator valueTranslator(glue, errorReporter, orphanage);

  KJ_IF_MAYBE(typeSchema, resolver.resolveBootstrapType(type, typeScope)) {
    kj::StringPtr fieldName = Schema::from<schema::Type>()
        .getUnionFields()[static_cast<uint>(typeSchema->which())].getProto().getName();

    KJ_IF_MAYBE(value, valueTranslator.compileValue(source, *typeSchema)) {
      if (typeSchema->isEnum()) {
        target.setEnum(value->getReader().as<DynamicEnum>().getRaw());
      } else {
        toDynamic(target).adopt(fieldName, kj::mv(*value));
      }
    }
  }
}